

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

int rtosc::enum_key(MetaContainer meta,char *value)

{
  bool bVar1;
  int iVar2;
  MetaIterator *pMVar3;
  char *pcVar4;
  char *in_RSI;
  MetaIterator a;
  MetaIterator m;
  MetaIterator __end1;
  MetaIterator __begin1;
  MetaContainer *__range1;
  int result;
  MetaContainer *in_stack_ffffffffffffffa0;
  char *__haystack;
  MetaIterator local_30;
  undefined1 *local_20;
  int local_14;
  char *local_10;
  undefined1 local_8 [8];
  
  local_10 = in_RSI;
  local_14 = std::numeric_limits<int>::min();
  local_20 = local_8;
  local_30 = Port::MetaContainer::begin(in_stack_ffffffffffffffa0);
  a = Port::MetaContainer::end((MetaContainer *)0x108fcf);
  while( true ) {
    bVar1 = Port::MetaIterator::operator!=(&local_30,a);
    if (!bVar1) {
      return local_14;
    }
    pMVar3 = Port::MetaIterator::operator*(&local_30);
    __haystack = pMVar3->title;
    pMVar3 = (MetaIterator *)pMVar3->value;
    pcVar4 = strstr(__haystack,"map ");
    if ((pcVar4 != (char *)0x0) && (iVar2 = strcmp((char *)pMVar3,local_10), iVar2 == 0)) break;
    Port::MetaIterator::operator++(pMVar3);
  }
  iVar2 = atoi(__haystack + 4);
  return iVar2;
}

Assistant:

int rtosc::enum_key(Port::MetaContainer meta, const char* value)
{
    int result = std::numeric_limits<int>::min();

    for(auto m:meta)
    if(strstr(m.title, "map "))
    if(!strcmp(m.value, value))
    {
        result = atoi(m.title+4);
        break;
    }

    assert(!meta["min"] || result >= atoi(meta["min"]));
    assert(!meta["max"] || result <= atoi(meta["max"]));

    return result;
}